

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QRingChunk>::reallocate
          (QMovableArrayOps<QRingChunk> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QRingChunk>_*,_QRingChunk_*> pVar1;
  
  pVar1 = QTypedArrayData<QRingChunk>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.
                     d,(this->super_QGenericArrayOps<QRingChunk>).
                       super_QArrayDataPointer<QRingChunk>.ptr,alloc,option);
  (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.d = pVar1.first;
  (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr = pVar1.second;
  return;
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }